

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::fontScalerShouldScaleForHeight(Test *this)

{
  byte bVar1;
  char *pcVar2;
  QString *pQVar3;
  double dVar4;
  FontScaler local_2f0 [8];
  QString local_2e8;
  QByteArray local_2d0;
  FontScaler local_2b8 [8];
  QString local_2b0;
  QByteArray local_298;
  FontScaler local_280 [8];
  QString local_278;
  QByteArray local_260;
  QString local_248;
  QByteArray local_230;
  QString local_218;
  QByteArray local_200;
  QString local_1e8;
  QByteArray local_1d0;
  FontScaler local_1b8 [8];
  double local_1b0;
  qreal scaledHeight;
  QByteArray local_190;
  QString local_178;
  QByteArray local_160;
  QString local_148;
  QByteArray local_130;
  undefined4 local_114;
  QString local_110;
  QByteArray local_f8;
  qreal local_e0;
  qreal factor;
  qreal wantedHeight;
  FontScaler scaler;
  QString local_a8;
  QFont local_90 [8];
  QFont f;
  QLatin1Char local_7f;
  QChar local_7e [7];
  QString local_70;
  QString local_58;
  QString local_40;
  QByteArray local_28;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  if (!fontFound) {
    QString::QString(&local_58,"Font %1 not found");
    QString::QString(&local_70,"Noto Sans");
    QLatin1Char::QLatin1Char(&local_7f,' ');
    QChar::QChar(local_7e,local_7f);
    QString::arg(&local_40,(int)&local_58,(QChar *)&local_70);
    QString::toLatin1(&local_28,&local_40);
    pcVar2 = QByteArray::operator_cast_to_char_(&local_28);
    QTest::qSkip(pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x6e);
    QByteArray::~QByteArray(&local_28);
    QString::~QString(&local_40);
    QString::~QString(&local_70);
    QString::~QString(&local_58);
    return;
  }
  QString::QString(&local_a8,"Noto Sans");
  QFont::QFont(local_90,&local_a8,-1,-1,false);
  QString::~QString(&local_a8);
  QFont::setPixelSize((int)local_90);
  KDReports::FontScaler::FontScaler((FontScaler *)&wantedHeight,local_90);
  factor = 50.0;
  KDReports::FontScaler::setFactorForHeight(50.0);
  local_e0 = FontScaler::scalingFactor((FontScaler *)&wantedHeight);
  if (local_e0 <= 0.42) {
    QString::number(local_e0,(char)&local_148,0x67);
    pQVar3 = QtPrivate::asString(&local_148);
    QString::toLocal8Bit(&local_130,pQVar3);
    pcVar2 = QByteArray::constData(&local_130);
    bVar1 = QTest::qVerify(false,"factor > 0.42",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x77);
    QByteArray::~QByteArray(&local_130);
    QString::~QString(&local_148);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  else {
    QString::number(local_e0,(char)&local_110,0x67);
    pQVar3 = QtPrivate::asString(&local_110);
    QString::toLocal8Bit(&local_f8,pQVar3);
    pcVar2 = QByteArray::constData(&local_f8);
    bVar1 = QTest::qVerify(true,"factor > 0.42",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x77);
    QByteArray::~QByteArray(&local_f8);
    QString::~QString(&local_110);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  if (0.49 <= local_e0) {
    QString::number(local_e0,(char)&scaledHeight,0x67);
    pQVar3 = QtPrivate::asString((QString *)&scaledHeight);
    QString::toLocal8Bit(&local_190,pQVar3);
    pcVar2 = QByteArray::constData(&local_190);
    bVar1 = QTest::qVerify(false,"factor < 0.49",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x78);
    QByteArray::~QByteArray(&local_190);
    QString::~QString((QString *)&scaledHeight);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  else {
    QString::number(local_e0,(char)&local_178,0x67);
    pQVar3 = QtPrivate::asString(&local_178);
    QString::toLocal8Bit(&local_160,pQVar3);
    pcVar2 = QByteArray::constData(&local_160);
    bVar1 = QTest::qVerify(true,"factor < 0.49",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x78);
    QByteArray::~QByteArray(&local_160);
    QString::~QString(&local_178);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  FontScaler::fontMetrics(local_1b8);
  dVar4 = (double)QFontMetricsF::height();
  QFontMetricsF::~QFontMetricsF((QFontMetricsF *)local_1b8);
  local_1b0 = dVar4;
  if (50.0 < dVar4) {
    QString::number(dVar4,(char)&local_218,0x67);
    pQVar3 = QtPrivate::asString(&local_218);
    QString::toLocal8Bit(&local_200,pQVar3);
    pcVar2 = QByteArray::constData(&local_200);
    bVar1 = QTest::qVerify(false,"scaledHeight <= wantedHeight",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x7c);
    QByteArray::~QByteArray(&local_200);
    QString::~QString(&local_218);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  else {
    QString::number(dVar4,(char)&local_1e8,0x67);
    pQVar3 = QtPrivate::asString(&local_1e8);
    QString::toLocal8Bit(&local_1d0,pQVar3);
    pcVar2 = QByteArray::constData(&local_1d0);
    bVar1 = QTest::qVerify(true,"scaledHeight <= wantedHeight",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x7c);
    QByteArray::~QByteArray(&local_1d0);
    QString::~QString(&local_1e8);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  if (local_1b0 <= 44.0) {
    QString::number(local_1b0,(char)&local_278,0x67);
    pQVar3 = QtPrivate::asString(&local_278);
    QString::toLocal8Bit(&local_260,pQVar3);
    pcVar2 = QByteArray::constData(&local_260);
    bVar1 = QTest::qVerify(false,"scaledHeight > wantedHeight - 6",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x7d);
    QByteArray::~QByteArray(&local_260);
    QString::~QString(&local_278);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  else {
    QString::number(local_1b0,(char)&local_248,0x67);
    pQVar3 = QtPrivate::asString(&local_248);
    QString::toLocal8Bit(&local_230,pQVar3);
    pcVar2 = QByteArray::constData(&local_230);
    bVar1 = QTest::qVerify(true,"scaledHeight > wantedHeight - 6",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x7d);
    QByteArray::~QByteArray(&local_230);
    QString::~QString(&local_248);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  KDReports::FontScaler::setFactorForHeight(2.9);
  FontScaler::fontMetrics(local_280);
  dVar4 = (double)QFontMetricsF::height();
  QFontMetricsF::~QFontMetricsF((QFontMetricsF *)local_280);
  if (4.0 < dVar4) {
    FontScaler::fontMetrics(local_2f0);
    dVar4 = (double)QFontMetricsF::height();
    QString::number(dVar4,(char)&local_2e8,0x67);
    pQVar3 = QtPrivate::asString(&local_2e8);
    QString::toLocal8Bit(&local_2d0,pQVar3);
    pcVar2 = QByteArray::constData(&local_2d0);
    bVar1 = QTest::qVerify(false,"scaler.fontMetrics().height() <= 4",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x86);
    QByteArray::~QByteArray(&local_2d0);
    QString::~QString(&local_2e8);
    QFontMetricsF::~QFontMetricsF((QFontMetricsF *)local_2f0);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  else {
    FontScaler::fontMetrics(local_2b8);
    dVar4 = (double)QFontMetricsF::height();
    QString::number(dVar4,(char)&local_2b0,0x67);
    pQVar3 = QtPrivate::asString(&local_2b0);
    QString::toLocal8Bit(&local_298,pQVar3);
    pcVar2 = QByteArray::constData(&local_298);
    bVar1 = QTest::qVerify(true,"scaler.fontMetrics().height() <= 4",pcVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x86);
    QByteArray::~QByteArray(&local_298);
    QString::~QString(&local_2b0);
    QFontMetricsF::~QFontMetricsF((QFontMetricsF *)local_2b8);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      local_114 = 1;
      goto LAB_00107048;
    }
  }
  local_114 = 0;
LAB_00107048:
  FontScaler::~FontScaler((FontScaler *)&wantedHeight);
  QFont::~QFont(local_90);
  return;
}

Assistant:

void fontScalerShouldScaleForHeight()
    {
#ifndef Q_OS_MAC // disabled on Mac due to a different DPI value. The code should be portable anyway :)
        SKIP_IF_FONT_NOT_FOUND

        QFont f(s_fontName);
        f.setPixelSize(86);
        FontScaler scaler(f);

        const qreal wantedHeight = 50;
        scaler.setFactorForHeight(wantedHeight);
        const qreal factor = scaler.scalingFactor();
        QVERIFY2(factor > 0.42, qPrintable(QString::number(factor)));
        QVERIFY2(factor < 0.49, qPrintable(QString::number(factor)));

        {
            const qreal scaledHeight = scaler.fontMetrics().height();
            QVERIFY2(scaledHeight <= wantedHeight, qPrintable(QString::number(scaledHeight)));
            QVERIFY2(scaledHeight > wantedHeight - 6, qPrintable(QString::number(scaledHeight)));
        }

#ifndef Q_OS_WIN
        // Testing a really small wanted height
        // Seems that on linux we can't go down to 2.7, the min is 3.0
        // Maybe because ascent=1, descent=1, height=1+1+1=3. Well, sometimes 4.
        // On Windows we can get 2, though.
        scaler.setFactorForHeight(2.9);
        QVERIFY2(scaler.fontMetrics().height() <= 4, qPrintable(QString::number(scaler.fontMetrics().height())));
#endif
#endif
    }